

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

void __thiscall
icu_63::NFRuleSet::setBestFractionRule
          (NFRuleSet *this,int32_t originalIndex,NFRule *newRule,UBool rememberRule)

{
  char16_t cVar1;
  UChar UVar2;
  UnicodeString local_78;
  DecimalFormatSymbols *local_38;
  DecimalFormatSymbols *decimalFormatSymbols;
  NFRule *bestResult;
  NFRule *pNStack_20;
  UBool rememberRule_local;
  NFRule *newRule_local;
  NFRuleSet *pNStack_10;
  int32_t originalIndex_local;
  NFRuleSet *this_local;
  
  bestResult._7_1_ = rememberRule;
  pNStack_20 = newRule;
  newRule_local._4_4_ = originalIndex;
  pNStack_10 = this;
  if (rememberRule != '\0') {
    NFRuleList::add(&this->fractionRules,newRule);
  }
  decimalFormatSymbols = (DecimalFormatSymbols *)this->nonNumericalRules[newRule_local._4_4_];
  if (decimalFormatSymbols == (DecimalFormatSymbols *)0x0) {
    this->nonNumericalRules[newRule_local._4_4_] = pNStack_20;
  }
  else {
    local_38 = RuleBasedNumberFormat::getDecimalFormatSymbols(this->owner);
    DecimalFormatSymbols::getSymbol(&local_78,local_38,kDecimalSeparatorSymbol);
    cVar1 = UnicodeString::charAt(&local_78,0);
    UVar2 = NFRule::getDecimalPoint(pNStack_20);
    UnicodeString::~UnicodeString(&local_78);
    if (cVar1 == UVar2) {
      this->nonNumericalRules[newRule_local._4_4_] = pNStack_20;
    }
  }
  return;
}

Assistant:

void NFRuleSet::setBestFractionRule(int32_t originalIndex, NFRule *newRule, UBool rememberRule) {
    if (rememberRule) {
        fractionRules.add(newRule);
    }
    NFRule *bestResult = nonNumericalRules[originalIndex];
    if (bestResult == NULL) {
        nonNumericalRules[originalIndex] = newRule;
    }
    else {
        // We have more than one. Which one is better?
        const DecimalFormatSymbols *decimalFormatSymbols = owner->getDecimalFormatSymbols();
        if (decimalFormatSymbols->getSymbol(DecimalFormatSymbols::kDecimalSeparatorSymbol).charAt(0)
            == newRule->getDecimalPoint())
        {
            nonNumericalRules[originalIndex] = newRule;
        }
        // else leave it alone
    }
}